

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::get_initial_page(LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   *this)

{
  LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (ControlBlock *)(this->m_initial_page).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

ControlBlock * get_initial_page() const noexcept
            {
                return reinterpret_cast<ControlBlock *>(m_initial_page.load());
            }